

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegGetCounter(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegCounter *pxVar2;
  
  iVar1 = ctxt->maxCounters;
  if ((long)iVar1 == 0) {
    ctxt->maxCounters = 4;
    pxVar2 = (xmlRegCounter *)(*xmlMalloc)(0x20);
    ctxt->counters = pxVar2;
    if (pxVar2 == (xmlRegCounter *)0x0) {
      xmlRegexpErrMemory(ctxt,"allocating counter");
      ctxt->maxCounters = 0;
      return -1;
    }
  }
  else if (ctxt->nbCounters < iVar1) {
    pxVar2 = ctxt->counters;
  }
  else {
    ctxt->maxCounters = iVar1 * 2;
    pxVar2 = (xmlRegCounter *)(*xmlRealloc)(ctxt->counters,(long)iVar1 << 4);
    if (pxVar2 == (xmlRegCounter *)0x0) {
      xmlRegexpErrMemory(ctxt,"allocating counter");
      ctxt->maxCounters = ctxt->maxCounters / 2;
      return -1;
    }
    ctxt->counters = pxVar2;
  }
  iVar1 = ctxt->nbCounters;
  pxVar2[iVar1].min = -1;
  pxVar2[iVar1].max = -1;
  ctxt->nbCounters = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
xmlRegGetCounter(xmlRegParserCtxtPtr ctxt) {
    if (ctxt->maxCounters == 0) {
	ctxt->maxCounters = 4;
	ctxt->counters = (xmlRegCounter *) xmlMalloc(ctxt->maxCounters *
		                             sizeof(xmlRegCounter));
	if (ctxt->counters == NULL) {
	    xmlRegexpErrMemory(ctxt, "allocating counter");
	    ctxt->maxCounters = 0;
	    return(-1);
	}
    } else if (ctxt->nbCounters >= ctxt->maxCounters) {
	xmlRegCounter *tmp;
	ctxt->maxCounters *= 2;
	tmp = (xmlRegCounter *) xmlRealloc(ctxt->counters, ctxt->maxCounters *
		                           sizeof(xmlRegCounter));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt, "allocating counter");
	    ctxt->maxCounters /= 2;
	    return(-1);
	}
	ctxt->counters = tmp;
    }
    ctxt->counters[ctxt->nbCounters].min = -1;
    ctxt->counters[ctxt->nbCounters].max = -1;
    return(ctxt->nbCounters++);
}